

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall libtorrent::aux::tracker_logger::debug_log(tracker_logger *this,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list v;
  char *local_e0;
  __va_list_tag local_d8;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_e0 = fmt;
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  iVar1 = (*(this->m_ses->super_session_logger)._vptr_session_logger[5])();
  if ((*(uint *)(CONCAT44(extraout_var,iVar1) + 0x68) >> 0xd & 1) != 0) {
    local_d8.reg_save_area = local_b8;
    local_d8.overflow_arg_area = &stack0x00000008;
    local_d8.gp_offset = 0x10;
    local_d8.fp_offset = 0x30;
    iVar1 = (*(this->m_ses->super_session_logger)._vptr_session_logger[5])();
    alert_manager::emplace_alert<libtorrent::log_alert,char_const*&,__va_list_tag(&)[1]>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar1),&local_e0,
               (__va_list_tag (*) [1])&local_d8);
  }
  return;
}

Assistant:

void tracker_logger::debug_log(const char* fmt, ...) const noexcept try
		{
			if (!m_ses.alerts().should_post<log_alert>()) return;

			va_list v;
			va_start(v, fmt);
			m_ses.alerts().emplace_alert<log_alert>(fmt, v);
			va_end(v);
		}
		catch (std::exception const&) {}